

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O2

int sprkStep_TakeStep(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  double dVar1;
  double dVar2;
  N_Vector p_Var3;
  ARKodeSPRKTable pAVar4;
  ARKodeSPRKStepMem pAVar5;
  int iVar6;
  N_Vector p_Var7;
  long lVar8;
  double dVar9;
  double local_68;
  ARKodeSPRKStepMem step_mem;
  
  step_mem = (ARKodeSPRKStepMem)0x0;
  iVar6 = sprkStep_AccessStepMem(ark_mem,"sprkStep_TakeStep",&step_mem);
  pAVar5 = step_mem;
  if (iVar6 == 0) {
    p_Var3 = ark_mem->ycur;
    dVar9 = 0.0;
    local_68 = 0.0;
    p_Var7 = ark_mem->yn;
    for (lVar8 = 0; pAVar4 = pAVar5->method, lVar8 < pAVar4->stages; lVar8 = lVar8 + 1) {
      dVar1 = pAVar4->a[lVar8];
      dVar2 = pAVar4->ahat[lVar8];
      dVar9 = dVar9 + dVar2;
      pAVar5->istage = (int)lVar8;
      N_VConst(0,pAVar5->sdata);
      iVar6 = (*pAVar5->f1)(ark_mem->h * dVar9 + ark_mem->tn,p_Var7,pAVar5->sdata,ark_mem->user_data
                           );
      pAVar5->nf1 = pAVar5->nf1 + 1;
      if (iVar6 != 0) {
        return -8;
      }
      local_68 = local_68 + dVar1;
      N_VLinearSum(0x3ff0000000000000,dVar2 * ark_mem->h,p_Var7,pAVar5->sdata,p_Var3);
      ark_mem->tcur = ark_mem->h * dVar9 + ark_mem->tn;
      N_VConst(0,pAVar5->sdata);
      iVar6 = (*pAVar5->f2)(ark_mem->h * local_68 + ark_mem->tn,p_Var3,pAVar5->sdata,
                            ark_mem->user_data);
      pAVar5->nf2 = pAVar5->nf2 + 1;
      if (iVar6 != 0) {
        return -8;
      }
      N_VLinearSum(0x3ff0000000000000,dVar1 * ark_mem->h,p_Var3,pAVar5->sdata,p_Var3);
      if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
         (iVar6 = (*ark_mem->ProcessStage)(ark_mem->tcur,ark_mem->ycur,ark_mem->user_data),
         iVar6 != 0)) {
        return -0x26;
      }
      pAVar5->istage = pAVar5->istage + 1;
      p_Var7 = p_Var3;
    }
    *nflagPtr = 0;
    *dsmPtr = 0.0;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int sprkStep_TakeStep(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  ARKodeSPRKStepMem step_mem = NULL;
  N_Vector prev_stage        = NULL;
  N_Vector curr_stage        = NULL;
  sunrealtype ci             = SUN_RCONST(0.0);
  sunrealtype chati          = SUN_RCONST(0.0);
  int is                     = 0;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  prev_stage = ark_mem->yn;
  curr_stage = ark_mem->ycur;
  for (is = 0; is < step_mem->method->stages; is++)
  {
    /* load/compute coefficients */
    sunrealtype ai    = step_mem->method->a[is];
    sunrealtype ahati = step_mem->method->ahat[is];

    ci += ai;
    chati += ahati;

    /* store current stage index */
    step_mem->istage = is;

    SUNLogInfo(ARK_LOGGER, "begin-stage",
               "stage = %i, t = " SUN_FORMAT_G ", that = " SUN_FORMAT_G, is,
               ark_mem->tn + ci * ark_mem->h, ark_mem->tn + chati * ark_mem->h);
    SUNLogExtraDebugVec(ARK_LOGGER, "stage", prev_stage, "z2_%i(:) =", is);

    /* evaluate p' with the previous velocity */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f1(step_mem, ark_mem->tn + chati * ark_mem->h, prev_stage,
                         step_mem->sdata, ark_mem->user_data);

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", step_mem->sdata,
                        "f1_%i(:) =", is);

    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);
      return ARK_RHSFUNC_FAIL;
    }

    /* position update */
    N_VLinearSum(ONE, prev_stage, ark_mem->h * ahati, step_mem->sdata,
                 curr_stage);

    /* set current stage time(s) */
    ark_mem->tcur = ark_mem->tn + chati * ark_mem->h;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage", curr_stage, "z1_%i(:) =", is);

    /* evaluate q' with the current positions */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f2(step_mem, ark_mem->tn + ci * ark_mem->h, curr_stage,
                         step_mem->sdata, ark_mem->user_data);

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", step_mem->sdata,
                        "f2_%i(:) =", is);

    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);
      return ARK_RHSFUNC_FAIL;
    }

    /* velocity update */
    N_VLinearSum(ONE, curr_stage, ark_mem->h * ai, step_mem->sdata, curr_stage);

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur, ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return (ARK_POSTPROCESS_STAGE_FAIL);
      }
    }

    /* keep track of the stage number */
    step_mem->istage++;

    prev_stage = curr_stage;

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  }

  *nflagPtr = 0;
  *dsmPtr   = 0;

  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");

  return ARK_SUCCESS;
}